

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_convert(nk_context *ctx,nk_buffer *cmds,nk_buffer *vertices,nk_buffer *elements,
                   nk_convert_config *config)

{
  nk_vec2 p1;
  nk_vec2 b;
  nk_rect rect;
  nk_vec2 cp1;
  nk_vec2 center;
  nk_vec2 center_00;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 c_00;
  nk_vec2 a;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  nk_vec2 pos_03;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_vec2 a_00;
  nk_image texture;
  nk_rect rect_03;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  nk_context *in_RDI;
  long in_R8;
  nk_command_custom *c_4;
  nk_command_image *i_3;
  nk_command_text *t_2;
  nk_vec2 pnt_2;
  nk_command_polyline *p_2;
  int i_2;
  nk_vec2 pnt_1;
  nk_command_polygon_filled *p_1;
  int i_1;
  nk_vec2 pnt;
  nk_command_polygon *p;
  int i;
  nk_command_triangle_filled *t_1;
  nk_command_triangle *t;
  nk_command_arc_filled *c_3;
  nk_command_arc *c_2;
  nk_command_circle_filled *c_1;
  nk_command_circle *c;
  nk_command_rect_multi_color *r_2;
  nk_command_rect_filled *r_1;
  nk_command_rect *r;
  nk_command_curve *q;
  nk_command_line *l;
  nk_command_scissor *s;
  nk_command *cmd;
  nk_flags res;
  undefined8 in_stack_fffffffffffffd48;
  nk_draw_list *list;
  nk_vec2 in_stack_fffffffffffffd50;
  float in_stack_fffffffffffffd58;
  nk_color in_stack_fffffffffffffd5c;
  float in_stack_fffffffffffffd60;
  nk_color in_stack_fffffffffffffd64;
  nk_vec2 in_stack_fffffffffffffd68;
  nk_vec2 in_stack_fffffffffffffd70;
  nk_draw_list *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  nk_draw_list *in_stack_fffffffffffffd88;
  nk_vec2 in_stack_fffffffffffffd90;
  nk_draw_list *in_stack_fffffffffffffda0;
  nk_draw_list *in_stack_fffffffffffffda8;
  nk_draw_list *in_stack_fffffffffffffdb0;
  nk_vec2 in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  float in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  nk_draw_list *in_stack_fffffffffffffdd8;
  nk_user_font *in_stack_fffffffffffffde0;
  nk_draw_list *in_stack_fffffffffffffde8;
  nk_draw_list *in_stack_fffffffffffffdf0;
  nk_draw_list *in_stack_fffffffffffffdf8;
  nk_draw_list *in_stack_fffffffffffffe00;
  nk_command *in_stack_fffffffffffffe10;
  nk_rect in_stack_fffffffffffffe18;
  int local_1a4;
  int local_18c;
  int local_174;
  nk_command *local_40;
  uint local_4;
  nk_anti_aliasing line_aa;
  
  if ((((in_RDI == (nk_context *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) ||
     (((in_RCX == 0 || (in_R8 == 0)) || (*(long *)(in_R8 + 0x28) == 0)))) {
    local_4 = 1;
  }
  else {
    line_aa = (nk_anti_aliasing)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    list = (nk_draw_list *)CONCAT44(line_aa,*(undefined4 *)(in_R8 + 8));
    nk_draw_list_setup((nk_draw_list *)in_stack_fffffffffffffd70,
                       (nk_convert_config *)in_stack_fffffffffffffd68,
                       (nk_buffer *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                       (nk_buffer *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                       (nk_buffer *)in_stack_fffffffffffffd50,line_aa,
                       (nk_anti_aliasing)in_stack_fffffffffffffd80);
    for (local_40 = nk__begin((nk_context *)
                              CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        local_40 != (nk_command *)0x0; local_40 = nk__next(in_RDI,local_40)) {
      uVar3 = (ulong)local_40->type;
      switch(uVar3) {
      case 0:
        break;
      case 1:
        in_stack_fffffffffffffe00 = &in_RDI->draw_list;
        nk_rect((float)(int)(short)local_40[1].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                (float)*(ushort *)&local_40[1].field_0x4,(float)*(ushort *)&local_40[1].field_0x6);
        rect.y = (float)in_stack_fffffffffffffd5c;
        rect.x = in_stack_fffffffffffffd58;
        rect.w = in_stack_fffffffffffffd60;
        rect.h = (float)in_stack_fffffffffffffd64;
        nk_draw_list_add_clip((nk_draw_list *)in_stack_fffffffffffffd50,rect);
        break;
      case 2:
        in_stack_fffffffffffffdf8 = &in_RDI->draw_list;
        nk_vec2((float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                (float)(int)*(short *)&local_40[1].field_0x4);
        nk_vec2((float)(int)*(short *)&local_40[1].field_0x6,(float)(int)(short)local_40[1].next);
        a_00.y = in_stack_fffffffffffffdc4;
        a_00.x = in_stack_fffffffffffffdc0;
        nk_draw_list_stroke_line
                  (in_stack_fffffffffffffda8,a_00,in_stack_fffffffffffffdb8,
                   SUB84((ulong)in_stack_fffffffffffffdb0 >> 0x20,0),
                   (float)((ulong)in_stack_fffffffffffffda0 >> 0x20));
        break;
      case 3:
        in_stack_fffffffffffffdf0 = &in_RDI->draw_list;
        nk_vec2((float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                (float)(int)*(short *)&local_40[1].field_0x4);
        nk_vec2((float)(int)*(short *)((long)&local_40[1].next + 2),
                (float)(int)*(short *)((long)&local_40[1].next + 4));
        nk_vec2((float)(int)*(short *)((long)&local_40[1].next + 6),
                (float)(int)(short)local_40[2].type);
        nk_vec2((float)(int)*(short *)&local_40[1].field_0x6,(float)(int)(short)local_40[1].next);
        cp1.y = (float)in_stack_fffffffffffffd64;
        cp1.x = in_stack_fffffffffffffd60;
        p1.y = (float)in_stack_fffffffffffffd5c;
        p1.x = in_stack_fffffffffffffd58;
        nk_draw_list_stroke_curve
                  (list,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,cp1,p1,
                   (nk_color)in_stack_fffffffffffffd50.y,0,1.58467e-39);
        break;
      case 4:
        in_stack_fffffffffffffde8 = &in_RDI->draw_list;
        nk_rect((float)(int)*(short *)&local_40[1].field_0x4,
                (float)(int)*(short *)&local_40[1].field_0x6,(float)(ushort)local_40[1].next,
                (float)*(ushort *)((long)&local_40[1].next + 2));
        rect_00.w = in_stack_fffffffffffffd90.x;
        rect_00.h = in_stack_fffffffffffffd90.y;
        rect_00._0_8_ = in_stack_fffffffffffffd88;
        nk_draw_list_stroke_rect
                  (in_stack_fffffffffffffd78,rect_00,
                   SUB84((ulong)in_stack_fffffffffffffd80 >> 0x20,0),in_stack_fffffffffffffd70.y,
                   in_stack_fffffffffffffd70.x);
        break;
      case 5:
        in_stack_fffffffffffffde0 = (nk_user_font *)&in_RDI->draw_list;
        nk_rect((float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                (float)(int)*(short *)&local_40[1].field_0x4,
                (float)*(ushort *)&local_40[1].field_0x6,(float)(ushort)local_40[1].next);
        rect_01.w = in_stack_fffffffffffffd90.x;
        rect_01.h = in_stack_fffffffffffffd90.y;
        rect_01._0_8_ = in_stack_fffffffffffffd88;
        nk_draw_list_fill_rect
                  (in_stack_fffffffffffffd78,rect_01,
                   SUB84((ulong)in_stack_fffffffffffffd80 >> 0x20,0),in_stack_fffffffffffffd70.y);
        break;
      case 6:
        in_stack_fffffffffffffdd8 = &in_RDI->draw_list;
        nk_rect((float)(int)(short)local_40[1].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                (float)*(ushort *)&local_40[1].field_0x4,(float)*(ushort *)&local_40[1].field_0x6);
        nk_draw_list_fill_rect_multi_color
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffe18,
                   SUB84((ulong)in_stack_fffffffffffffe10 >> 0x20,0),
                   SUB84(in_stack_fffffffffffffe10,0),SUB84(uVar3 >> 0x20,0),SUB84(uVar3,0));
        break;
      case 7:
        in_stack_fffffffffffffdd4 = 0x3f000000;
        nk_vec2((float)(int)(short)local_40[1].type + (float)*(ushort *)&local_40[1].field_0x6 * 0.5
                ,(float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2) +
                 (float)(ushort)local_40[1].next * 0.5);
        center.y = (float)in_stack_fffffffffffffd64;
        center.x = in_stack_fffffffffffffd60;
        nk_draw_list_stroke_circle
                  ((nk_draw_list *)in_stack_fffffffffffffd50,center,(float)((ulong)list >> 0x20),
                   in_stack_fffffffffffffd5c,(uint)list,0.0);
        break;
      case 8:
        in_stack_fffffffffffffdb8 = (nk_vec2)&in_RDI->draw_list;
        in_stack_fffffffffffffdc4 = 0.5;
        nk_vec2((float)(int)(short)local_40[1].type + (float)*(ushort *)&local_40[1].field_0x4 * 0.5
                ,(float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2) +
                 (float)*(ushort *)&local_40[1].field_0x6 * 0.5);
        center_00.y = (float)in_stack_fffffffffffffd64;
        center_00.x = in_stack_fffffffffffffd60;
        nk_draw_list_fill_circle
                  ((nk_draw_list *)in_stack_fffffffffffffd50,center_00,(float)((ulong)list >> 0x20),
                   in_stack_fffffffffffffd5c,(uint)list);
        break;
      case 9:
        in_stack_fffffffffffffda8 = &in_RDI->draw_list;
        nk_vec2((float)(int)(short)local_40[1].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2));
        pos.y = (float)in_stack_fffffffffffffd64;
        pos.x = in_stack_fffffffffffffd60;
        nk_draw_list_path_line_to
                  ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),pos
                  );
        in_stack_fffffffffffffdb0 = &in_RDI->draw_list;
        nk_vec2((float)(int)(short)local_40[1].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2));
        nk_draw_list_path_arc_to
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,
                   (float)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                   (float)in_stack_fffffffffffffd80,
                   (float)((ulong)in_stack_fffffffffffffd78 >> 0x20),(uint)in_stack_fffffffffffffd78
                  );
        nk_draw_list_path_stroke
                  ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   in_stack_fffffffffffffd64,(nk_draw_list_stroke)in_stack_fffffffffffffd50.y,
                   in_stack_fffffffffffffd50.x);
        break;
      case 10:
        nk_vec2((float)(int)(short)local_40[1].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2));
        pos_00.y = (float)in_stack_fffffffffffffd64;
        pos_00.x = in_stack_fffffffffffffd60;
        nk_draw_list_path_line_to
                  ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   pos_00);
        in_stack_fffffffffffffda0 = &in_RDI->draw_list;
        nk_vec2((float)(int)(short)local_40[1].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2));
        nk_draw_list_path_arc_to
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,
                   (float)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                   (float)in_stack_fffffffffffffd80,
                   (float)((ulong)in_stack_fffffffffffffd78 >> 0x20),(uint)in_stack_fffffffffffffd78
                  );
        nk_draw_list_path_fill(list,(nk_color)in_stack_fffffffffffffd50.y);
        break;
      case 0xb:
        in_stack_fffffffffffffd90 = (nk_vec2)&in_RDI->draw_list;
        nk_vec2((float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                (float)(int)*(short *)&local_40[1].field_0x4);
        nk_vec2((float)(int)*(short *)&local_40[1].field_0x6,(float)(int)(short)local_40[1].next);
        nk_vec2((float)(int)*(short *)((long)&local_40[1].next + 2),
                (float)(int)*(short *)((long)&local_40[1].next + 4));
        c_00.y = (float)in_stack_fffffffffffffd64;
        c_00.x = in_stack_fffffffffffffd60;
        nk_draw_list_stroke_triangle
                  ((nk_draw_list *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68,c_00,in_stack_fffffffffffffd5c,
                   (float)((ulong)list >> 0x20));
        break;
      case 0xc:
        in_stack_fffffffffffffd88 = &in_RDI->draw_list;
        nk_vec2((float)(int)(short)local_40[1].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2));
        nk_vec2((float)(int)*(short *)&local_40[1].field_0x4,
                (float)(int)*(short *)&local_40[1].field_0x6);
        nk_vec2((float)(int)(short)local_40[1].next,
                (float)(int)*(short *)((long)&local_40[1].next + 2));
        a.y = (float)in_stack_fffffffffffffd64;
        a.x = in_stack_fffffffffffffd60;
        b.y = (float)in_stack_fffffffffffffd5c;
        b.x = in_stack_fffffffffffffd58;
        nk_draw_list_fill_triangle
                  ((nk_draw_list *)0x114864,a,b,in_stack_fffffffffffffd50,
                   SUB84((ulong)list >> 0x20,0));
        break;
      case 0xd:
        for (local_174 = 0; local_174 < (int)(uint)*(ushort *)&local_40[1].field_0x6;
            local_174 = local_174 + 1) {
          nk_vec2((float)(int)*(short *)((long)&local_40[1].next + (long)local_174 * 4),
                  (float)(int)*(short *)((long)&local_40[1].next + (long)local_174 * 4 + 2));
          pos_01.y = (float)in_stack_fffffffffffffd64;
          pos_01.x = in_stack_fffffffffffffd60;
          nk_draw_list_path_line_to
                    ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     pos_01);
        }
        nk_draw_list_path_stroke
                  ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   in_stack_fffffffffffffd64,(nk_draw_list_stroke)in_stack_fffffffffffffd50.y,
                   in_stack_fffffffffffffd50.x);
        break;
      case 0xe:
        for (local_18c = 0; local_18c < (int)(uint)*(ushort *)&local_40[1].field_0x4;
            local_18c = local_18c + 1) {
          nk_vec2((float)(int)*(short *)(&local_40[1].field_0x6 + (long)local_18c * 4),
                  (float)(int)*(short *)((long)&local_40[1].next + (long)local_18c * 4));
          pos_02.y = (float)in_stack_fffffffffffffd64;
          pos_02.x = in_stack_fffffffffffffd60;
          nk_draw_list_path_line_to
                    ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     pos_02);
        }
        nk_draw_list_path_fill(list,(nk_color)in_stack_fffffffffffffd50.y);
        break;
      case 0xf:
        for (local_1a4 = 0; local_1a4 < (int)(uint)*(ushort *)&local_40[1].field_0x6;
            local_1a4 = local_1a4 + 1) {
          nk_vec2((float)(int)*(short *)((long)&local_40[1].next + (long)local_1a4 * 4),
                  (float)(int)*(short *)((long)&local_40[1].next + (long)local_1a4 * 4 + 2));
          pos_03.y = (float)in_stack_fffffffffffffd64;
          pos_03.x = in_stack_fffffffffffffd60;
          nk_draw_list_path_line_to
                    ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     pos_03);
        }
        nk_draw_list_path_stroke
                  ((nk_draw_list *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   in_stack_fffffffffffffd64,(nk_draw_list_stroke)in_stack_fffffffffffffd50.y,
                   in_stack_fffffffffffffd50.x);
        break;
      case 0x10:
        in_stack_fffffffffffffd78 = &in_RDI->draw_list;
        in_stack_fffffffffffffd80 = *(undefined8 *)(local_40 + 1);
        nk_rect((float)(int)(short)local_40[2].type,
                (float)(int)(short)*(undefined2 *)((long)&local_40[2].type + 2),
                (float)*(ushort *)&local_40[2].field_0x4,(float)*(ushort *)&local_40[2].field_0x6);
        rect_03._8_8_ = in_stack_fffffffffffffe00;
        rect_03._0_8_ = in_stack_fffffffffffffdf8;
        nk_draw_list_add_text
                  (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,rect_03,
                   (char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                   in_stack_fffffffffffffdd0,SUB84((ulong)in_stack_fffffffffffffdf0 >> 0x20,0));
        break;
      case 0x11:
        in_stack_fffffffffffffd70 = (nk_vec2)&in_RDI->draw_list;
        in_stack_fffffffffffffd68 = (nk_vec2)&local_40[1].next;
        in_stack_fffffffffffffe18 =
             nk_rect((float)(int)(short)local_40[1].type,
                     (float)(int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                     (float)*(ushort *)&local_40[1].field_0x4,
                     (float)*(ushort *)&local_40[1].field_0x6);
        in_stack_fffffffffffffd58 = (float)*(undefined8 *)((long)in_stack_fffffffffffffd68 + 0x10);
        in_stack_fffffffffffffd5c =
             SUB84((ulong)*(undefined8 *)((long)in_stack_fffffffffffffd68 + 0x10) >> 0x20,0);
        list = *(nk_draw_list **)in_stack_fffffffffffffd68;
        in_stack_fffffffffffffd50 = *(nk_vec2 *)((long)in_stack_fffffffffffffd68 + 8);
        texture.handle._4_4_ = in_stack_fffffffffffffdd4;
        texture.handle.id = (int)in_stack_fffffffffffffdd0;
        texture._8_8_ = in_stack_fffffffffffffdd8;
        texture._16_8_ = in_stack_fffffffffffffde0;
        rect_02.w = in_stack_fffffffffffffdc0;
        rect_02.x = in_stack_fffffffffffffdb8.x;
        rect_02.y = in_stack_fffffffffffffdb8.y;
        rect_02.h = in_stack_fffffffffffffdc4;
        nk_draw_list_add_image
                  (in_stack_fffffffffffffda8,texture,rect_02,
                   SUB84((ulong)in_stack_fffffffffffffdb0 >> 0x20,0));
        break;
      case 0x12:
        in_stack_fffffffffffffe10 = local_40;
        (**(code **)(local_40 + 2))
                  (&in_RDI->draw_list,(int)(short)local_40[1].type,
                   (int)(short)*(undefined2 *)((long)&local_40[1].type + 2),
                   *(undefined2 *)&local_40[1].field_0x4,*(undefined2 *)&local_40[1].field_0x6,
                   local_40[1].next);
      }
    }
    uVar1 = 0;
    if ((ulong)(*(long *)(in_RSI + 0x58) + (*(long *)(in_RSI + 0x48) - *(long *)(in_RSI + 0x70))) <
        *(ulong *)(in_RSI + 0x60)) {
      uVar1 = 2;
    }
    uVar2 = 0;
    if (*(ulong *)(in_RDX + 0x58) < *(ulong *)(in_RDX + 0x60)) {
      uVar2 = 4;
    }
    local_4 = 0;
    if (*(ulong *)(in_RCX + 0x58) < *(ulong *)(in_RCX + 0x60)) {
      local_4 = 8;
    }
    local_4 = local_4 | uVar2 | uVar1;
  }
  return local_4;
}

Assistant:

NK_API nk_flags
nk_convert(struct nk_context *ctx, struct nk_buffer *cmds,
struct nk_buffer *vertices, struct nk_buffer *elements,
const struct nk_convert_config *config)
{
nk_flags res = NK_CONVERT_SUCCESS;
const struct nk_command *cmd;
NK_ASSERT(ctx);
NK_ASSERT(cmds);
NK_ASSERT(vertices);
NK_ASSERT(elements);
NK_ASSERT(config);
NK_ASSERT(config->vertex_layout);
NK_ASSERT(config->vertex_size);
if (!ctx || !cmds || !vertices || !elements || !config || !config->vertex_layout)
return NK_CONVERT_INVALID_PARAM;

nk_draw_list_setup(&ctx->draw_list, config, cmds, vertices, elements,
config->line_AA, config->shape_AA);
nk_foreach(cmd, ctx)
{
#ifdef NK_INCLUDE_COMMAND_USERDATA
ctx->draw_list.userdata = cmd->userdata;
#endif
switch (cmd->type) {
case NK_COMMAND_NOP: break;
case NK_COMMAND_SCISSOR: {
const struct nk_command_scissor *s = (const struct nk_command_scissor*)cmd;
nk_draw_list_add_clip(&ctx->draw_list, nk_rect(s->x, s->y, s->w, s->h));
} break;
case NK_COMMAND_LINE: {
const struct nk_command_line *l = (const struct nk_command_line*)cmd;
nk_draw_list_stroke_line(&ctx->draw_list, nk_vec2(l->begin.x, l->begin.y),
nk_vec2(l->end.x, l->end.y), l->color, l->line_thickness);
} break;
case NK_COMMAND_CURVE: {
const struct nk_command_curve *q = (const struct nk_command_curve*)cmd;
nk_draw_list_stroke_curve(&ctx->draw_list, nk_vec2(q->begin.x, q->begin.y),
nk_vec2(q->ctrl[0].x, q->ctrl[0].y), nk_vec2(q->ctrl[1].x,
q->ctrl[1].y), nk_vec2(q->end.x, q->end.y), q->color,
config->curve_segment_count, q->line_thickness);
} break;
case NK_COMMAND_RECT: {
const struct nk_command_rect *r = (const struct nk_command_rect*)cmd;
nk_draw_list_stroke_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
r->color, (float)r->rounding, r->line_thickness);
} break;
case NK_COMMAND_RECT_FILLED: {
const struct nk_command_rect_filled *r = (const struct nk_command_rect_filled*)cmd;
nk_draw_list_fill_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
r->color, (float)r->rounding);
} break;
case NK_COMMAND_RECT_MULTI_COLOR: {
const struct nk_command_rect_multi_color *r = (const struct nk_command_rect_multi_color*)cmd;
nk_draw_list_fill_rect_multi_color(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
r->left, r->top, r->right, r->bottom);
} break;
case NK_COMMAND_CIRCLE: {
const struct nk_command_circle *c = (const struct nk_command_circle*)cmd;
nk_draw_list_stroke_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
(float)c->y + (float)c->h/2), (float)c->w/2, c->color,
config->circle_segment_count, c->line_thickness);
} break;
case NK_COMMAND_CIRCLE_FILLED: {
const struct nk_command_circle_filled *c = (const struct nk_command_circle_filled *)cmd;
nk_draw_list_fill_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
(float)c->y + (float)c->h/2), (float)c->w/2, c->color,
config->circle_segment_count);
} break;
case NK_COMMAND_ARC: {
const struct nk_command_arc *c = (const struct nk_command_arc*)cmd;
nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
c->a[0], c->a[1], config->arc_segment_count);
nk_draw_list_path_stroke(&ctx->draw_list, c->color, NK_STROKE_CLOSED, c->line_thickness);
} break;
case NK_COMMAND_ARC_FILLED: {
const struct nk_command_arc_filled *c = (const struct nk_command_arc_filled*)cmd;
nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
c->a[0], c->a[1], config->arc_segment_count);
nk_draw_list_path_fill(&ctx->draw_list, c->color);
} break;
case NK_COMMAND_TRIANGLE: {
const struct nk_command_triangle *t = (const struct nk_command_triangle*)cmd;
nk_draw_list_stroke_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color,
t->line_thickness);
} break;
case NK_COMMAND_TRIANGLE_FILLED: {
const struct nk_command_triangle_filled *t = (const struct nk_command_triangle_filled*)cmd;
nk_draw_list_fill_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color);
} break;
case NK_COMMAND_POLYGON: {
int i;
const struct nk_command_polygon*p = (const struct nk_command_polygon*)cmd;
for (i = 0; i < p->point_count; ++i) {
struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
nk_draw_list_path_line_to(&ctx->draw_list, pnt);
}
nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_CLOSED, p->line_thickness);
} break;
case NK_COMMAND_POLYGON_FILLED: {
int i;
const struct nk_command_polygon_filled *p = (const struct nk_command_polygon_filled*)cmd;
for (i = 0; i < p->point_count; ++i) {
struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
nk_draw_list_path_line_to(&ctx->draw_list, pnt);
}
nk_draw_list_path_fill(&ctx->draw_list, p->color);
} break;
case NK_COMMAND_POLYLINE: {
int i;
const struct nk_command_polyline *p = (const struct nk_command_polyline*)cmd;
for (i = 0; i < p->point_count; ++i) {
struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
nk_draw_list_path_line_to(&ctx->draw_list, pnt);
}
nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_OPEN, p->line_thickness);
} break;
case NK_COMMAND_TEXT: {
const struct nk_command_text *t = (const struct nk_command_text*)cmd;
nk_draw_list_add_text(&ctx->draw_list, t->font, nk_rect(t->x, t->y, t->w, t->h),
t->string, t->length, t->height, t->foreground);
} break;
case NK_COMMAND_IMAGE: {
const struct nk_command_image *i = (const struct nk_command_image*)cmd;
nk_draw_list_add_image(&ctx->draw_list, i->img, nk_rect(i->x, i->y, i->w, i->h), i->col);
} break;
case NK_COMMAND_CUSTOM: {
const struct nk_command_custom *c = (const struct nk_command_custom*)cmd;
c->callback(&ctx->draw_list, c->x, c->y, c->w, c->h, c->callback_data);
} break;
default: break;
}
}
res |= (cmds->needed > cmds->allocated + (cmds->memory.size - cmds->size)) ? NK_CONVERT_COMMAND_BUFFER_FULL: 0;
res |= (vertices->needed > vertices->allocated) ? NK_CONVERT_VERTEX_BUFFER_FULL: 0;
res |= (elements->needed > elements->allocated) ? NK_CONVERT_ELEMENT_BUFFER_FULL: 0;
return res;
}